

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

void __thiscall
embree::DielectricMaterial::DielectricMaterial
          (DielectricMaterial *this,Vec3fa *transmissionOutside,Vec3fa *transmissionInside,
          float etaOutside,float etaInside)

{
  undefined8 uVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  SceneGraph::Node::Node((Node *)this,&local_48);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002cc7e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002ccdb0;
  (this->base).type = 4;
  uVar1 = *(undefined8 *)((long)&transmissionOutside->field_0 + 8);
  *(undefined8 *)&(this->transmissionOutside).field_0 = *(undefined8 *)&transmissionOutside->field_0
  ;
  *(undefined8 *)((long)&(this->transmissionOutside).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&transmissionInside->field_0 + 8);
  *(undefined8 *)&(this->transmissionInside).field_0 = *(undefined8 *)&transmissionInside->field_0;
  *(undefined8 *)((long)&(this->transmissionInside).field_0 + 8) = uVar1;
  this->etaOutside = etaOutside;
  this->etaInside = etaInside;
  return;
}

Assistant:

DielectricMaterial (const Vec3fa& transmissionOutside, const Vec3fa& transmissionInside, const float etaOutside, const float etaInside)
      : base(MATERIAL_DIELECTRIC), transmissionOutside(transmissionOutside), transmissionInside(transmissionInside), etaOutside(etaOutside), etaInside(etaInside) {}